

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QStringList * __thiscall
MakefileGenerator::fileFixify
          (MakefileGenerator *this,QStringList *files,FileFixifyTypes fix,bool canon)

{
  bool bVar1;
  const_iterator o;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QStringList *ret;
  MakefileGenerator *in_stack_00000040;
  ConstIterator it;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_000004ec;
  QList<QString> *this_00;
  const_iterator local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x18b232);
  if (bVar1) {
    QList<QString>::QList(this_00,in_RDI);
  }
  else {
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).size = -0x5555555555555556;
    QList<QString>::QList((QList<QString> *)0x18b279);
    local_18[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_18[0] = QList<QString>::begin(this_00);
    while( true ) {
      o = QList<QString>::end(this_00);
      bVar1 = QList<QString>::const_iterator::operator!=(local_18,o);
      if (!bVar1) break;
      QList<QString>::const_iterator::operator*(local_18);
      bVar1 = QString::isEmpty((QString *)0x18b2ca);
      if (!bVar1) {
        QList<QString>::const_iterator::operator*(local_18);
        fileFixify(in_stack_00000040,(QString *)ret,(FileFixifyTypes)in_stack_000004ec.i,this._7_1_)
        ;
        QList<QString>::operator<<(this_00,(rvalue_ref)in_RDI);
        QString::~QString((QString *)0x18b318);
      }
      QList<QString>::const_iterator::operator++(local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QStringList
MakefileGenerator::fileFixify(const QStringList &files, FileFixifyTypes fix, bool canon) const
{
    if(files.isEmpty())
        return files;
    QStringList ret;
    for(QStringList::ConstIterator it = files.begin(); it != files.end(); ++it) {
        if(!(*it).isEmpty())
            ret << fileFixify((*it), fix, canon);
    }
    return ret;
}